

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

void __thiscall cfd::core::DescriptorNode::AnalyzeAll(DescriptorNode *this,string *parent_name)

{
  pointer *ppuVar1;
  pointer *ppbVar2;
  size_t __n;
  pointer pcVar3;
  pointer pDVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  long *plVar8;
  size_t sVar9;
  CfdException *pCVar10;
  pointer pbVar11;
  size_type *psVar12;
  long lVar13;
  long lVar14;
  DescriptorNode *this_00;
  undefined1 *puVar15;
  long lVar16;
  pointer this_01;
  pointer pDVar17;
  uint uVar18;
  DescriptorNode *child;
  size_type __n_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp_args;
  size_t written;
  string miniscript;
  undefined1 local_3e0 [16];
  pointer local_3d0;
  _func_int **local_3b8;
  pointer local_3a0;
  TapBranch local_388;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_310;
  Script local_2f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8 [10];
  size_t local_b0;
  TapBranch local_a8;
  
  if (this->node_type_ != kDescriptorTypeNumber) {
    if (this->node_type_ == kDescriptorTypeKey) {
      AnalyzeKey(this);
      return;
    }
    __n = (this->name_)._M_string_length;
    if (__n == 0) {
      miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x4eb);
      miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
      logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                    "Failed to name field empty. Analyze NG.");
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&miniscript,"Failed to analyze descriptor.","");
      CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
      __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pcVar3 = (this->name_)._M_dataplus._M_p;
    lVar16 = 0x26;
    do {
      if (__n == *(size_t *)
                  ((long)&Script::SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_left + lVar16 + 2)) {
        iVar6 = bcmp(pcVar3,*(void **)((long)&Script::SetStackData::kUseScriptNum3._M_t._M_impl.
                                              super__Rb_tree_header._M_header._M_parent + lVar16 + 2
                                      ),__n);
        if (iVar6 == 0) {
          if ((*(char *)(lVar16 + 0x6bba5e) == '\x01') && (this->depth_ != 0)) {
            miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
            miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x51f);
            miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
            logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                          "Failed to analyse descriptor. The target can only exist at the top.");
            pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
            miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&miniscript,
                       "Failed to analyse descriptor. The target can only exist at the top.","");
            CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
            __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
          }
          pDVar17 = (this->child_node_).
                    super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar4 = (this->child_node_).
                   super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (*(char *)(lVar16 + 0x6bba5f) == '\x01') {
            if (pDVar17 == pDVar4) {
              miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
              miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x527);
              miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
              logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                            "Failed to child node empty.");
              pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
              miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&miniscript,"Failed to child node empty.","");
              CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
              __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
            }
          }
          else if (pDVar17 != pDVar4) {
            miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
            miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x52d);
            miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
            temp_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(((long)pDVar4 - (long)pDVar17 >> 3) * 0x4fa4fa4fa4fa4fa5);
            logger::log<unsigned_long&>
                      ((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                       "Failed to child node num. size={}",(unsigned_long *)&temp_args);
            pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
            miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&miniscript,"Failed to child node num.","");
            CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
            __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
          }
          if (*(char *)((long)&kDescriptorNodeScriptTable + lVar16) == '\x01') {
            iVar6 = ::std::__cxx11::string::compare((char *)&this->parent_kind_);
            if (iVar6 == 0) {
              miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
              miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x535);
              miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
              logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                            "Failed to multisig. taproot is unsupported.");
              pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
              miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&miniscript,"Failed to multisig. taproot is unsupported.","");
              CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
              __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
            }
            pDVar17 = (this->child_node_).
                      super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            temp_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(((long)(this->child_node_).
                                  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar17 >> 3) *
                          0x4fa4fa4fa4fa4fa5);
            if (temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start < (pointer)0x2) {
              miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
              miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x53c);
              miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
              logger::log<unsigned_long&>
                        ((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                         "Failed to multisig node low. size={}",(unsigned_long *)&temp_args);
              pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
              miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&miniscript,"Failed to multisig node low.","");
              CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
              __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
            }
            if (((undefined1 *)(ulong)pDVar17->number_ == (undefined1 *)0x0) ||
               (puVar15 = (undefined1 *)
                          ((long)&temp_args.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].field_2 + 0xf),
               puVar15 < (undefined1 *)(ulong)pDVar17->number_)) {
              miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
              miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x545);
              miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
              logger::log<unsigned_int&>
                        ((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                         "Failed to multisig require num. num={}",&pDVar17->number_);
              pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
              miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&miniscript,"Failed to multisig require num.","");
              CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
              __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
            }
            iVar6 = ::std::__cxx11::string::compare((char *)parent_name);
            if ((undefined1 *)((ulong)(iVar6 == 0) * 4 + 0x10) < puVar15) {
              miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
              miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x54f);
              miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
              temp_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(((long)(this->child_node_).
                                    super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->child_node_).
                                    super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4fa4fa4fa4fa4fa5 + -1);
              logger::log<unsigned_long&>
                        ((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                         "Failed to multisig pubkey num. num={}",(unsigned_long *)&temp_args);
              pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
              miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&miniscript,"Failed to multisig pubkey num.","");
              CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
              __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
            }
            pDVar4 = (this->child_node_).
                     super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pDVar17 = (this->child_node_).
                           super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ._M_impl.super__Vector_impl_data._M_start; pDVar17 != pDVar4;
                pDVar17 = pDVar17 + 1) {
              AnalyzeAll(pDVar17,&this->name_);
            }
            iVar6 = ::std::__cxx11::string::compare((char *)parent_name);
            if (iVar6 == 0) {
              this->script_type_ = *(DescriptorScriptType *)(lVar16 + 0x6bba5a);
              GetReference((DescriptorScriptReference *)&miniscript,this,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)0x0,(DescriptorNode *)0x0);
              Script::Script((Script *)&temp_args,(Script *)&miniscript._M_string_length);
              Script::GetData((ByteData *)&script,(Script *)&temp_args);
              sVar9 = ByteData::GetDataSize((ByteData *)&script);
              if (script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(script.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (sVar9 - 0x206 < 0xfffffffffffffdf7) {
                script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
                script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_ = 0x55f;
                script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = "AnalyzeAll";
                Script::GetData((ByteData *)&written,(Script *)&temp_args);
                local_b0 = ByteData::GetDataSize((ByteData *)&written);
                logger::log<unsigned_long&>
                          ((CfdSourceLocation *)&script,kCfdLogLevelWarning,
                           "Failed to script size over. size={}",&local_b0);
                if (written != 0) {
                  operator_delete((void *)written);
                }
                pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)&script.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&script,"Failed to script size over.","");
                CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)&script);
                __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
              }
              Script::~Script((Script *)&temp_args);
              DescriptorScriptReference::~DescriptorScriptReference
                        ((DescriptorScriptReference *)&miniscript);
            }
            else {
              iVar6 = ::std::__cxx11::string::compare((char *)parent_name);
              if (iVar6 == 0) {
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pDVar17 = (this->child_node_).
                          super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pDVar4 = (this->child_node_).
                         super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (pDVar17 != pDVar4) {
                  do {
                    if (pDVar17->node_type_ != kDescriptorTypeNumber) {
                      miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&miniscript,"0","");
                      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&temp_args,&miniscript);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)miniscript._M_dataplus._M_p != &miniscript.field_2) {
                        operator_delete(miniscript._M_dataplus._M_p);
                      }
                      GetPubkey((Pubkey *)&miniscript,pDVar17,&temp_args);
                      bVar5 = Pubkey::IsCompress((Pubkey *)&miniscript);
                      if (miniscript._M_dataplus._M_p != (pointer)0x0) {
                        operator_delete(miniscript._M_dataplus._M_p);
                      }
                      if (!bVar5) {
                        miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                        miniscript._M_string_length =
                             CONCAT44(miniscript._M_string_length._4_4_,0x56e);
                        miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                        logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                                      "Failed to multisig uncompress pubkey. wsh is compress only.")
                        ;
                        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                        miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&miniscript,
                                   "Failed to multisig uncompress pubkey. wsh is compress only.","")
                        ;
                        CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                        __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
                      }
                    }
                    pDVar17 = pDVar17 + 1;
                  } while (pDVar17 != pDVar4);
                }
LAB_00410019:
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&temp_args);
              }
            }
          }
          else {
            iVar6 = ::std::__cxx11::string::compare((char *)this);
            if (iVar6 == 0) {
              core::Address::Address((Address *)&miniscript,&this->value_,&this->addr_prefixes_);
              script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
              script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0x578;
              script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = "AnalyzeAll";
              core::Address::GetAddress_abi_cxx11_((string *)&temp_args,(Address *)&miniscript);
              logger::log<std::__cxx11::string&>
                        ((CfdSourceLocation *)&script,kCfdLogLevelInfo,"Address={}",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &temp_args);
              if (temp_args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&temp_args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(temp_args.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_2b8);
              Script::~Script(&local_2f8);
              local_388._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
              ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
              ~vector(&local_310);
              TapBranch::~TapBranch(&local_388);
              if (local_3a0 != (pointer)0x0) {
                operator_delete(local_3a0);
              }
              if (local_3b8 != (_func_int **)0x0) {
                operator_delete(local_3b8);
              }
              if (local_3d0 != (pointer)0x0) {
                operator_delete(local_3d0);
              }
              if ((undefined1 *)miniscript.field_2._M_allocated_capacity != local_3e0) {
                operator_delete((void *)miniscript.field_2._M_allocated_capacity);
              }
            }
            else {
              iVar6 = ::std::__cxx11::string::compare((char *)this);
              if (iVar6 == 0) {
                Script::Script((Script *)&miniscript,&this->value_);
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x583b45;
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)CONCAT44(temp_args.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x57b);
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_9bcd5c;
                Script::GetData((ByteData *)&script,(Script *)&miniscript);
                written = ByteData::GetDataSize((ByteData *)&script);
                logger::log<unsigned_long&>
                          ((CfdSourceLocation *)&temp_args,kCfdLogLevelInfo,"script size={}",
                           &written);
                if (script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(script.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                Script::~Script((Script *)&miniscript);
                goto LAB_00410023;
              }
              iVar6 = ::std::__cxx11::string::compare((char *)this);
              pDVar17 = (this->child_node_).
                        super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar13 = (long)(this->child_node_).
                             super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar17;
              lVar14 = lVar13 >> 3;
              if (iVar6 == 0) {
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)(lVar14 * 0x4fa4fa4fa4fa4fa5);
                if ((undefined1 *)0x1 <
                    (undefined1 *)
                    ((long)&temp_args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].field_2 + 0xfU)) {
                  miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                  miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x57f);
                  miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                  logger::log<unsigned_long&>
                            ((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                             "Failed to taproot node num. size={}",(unsigned_long *)&temp_args);
                  pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                  ::std::operator+(&miniscript,"Failed to taproot node num.",
                                   &((this->child_node_).
                                     super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->value_);
                  CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                  __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
                }
                pDVar17->node_type_ = kDescriptorTypeKey;
                ::std::__cxx11::string::operator=((string *)&pDVar17->parent_kind_,"tr");
                AnalyzeAll((this->child_node_).
                           super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ._M_impl.super__Vector_impl_data._M_start,&this->name_);
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)&miniscript,"0","");
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &temp_args,&miniscript);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)miniscript._M_dataplus._M_p != &miniscript.field_2) {
                  operator_delete(miniscript._M_dataplus._M_p);
                }
                GetPubkey((Pubkey *)&miniscript,
                          (this->child_node_).
                          super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,&temp_args);
                bVar5 = Pubkey::IsCompress((Pubkey *)&miniscript);
                if (miniscript._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(miniscript._M_dataplus._M_p);
                }
                if (!bVar5) {
                  miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                  miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x58d);
                  miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                  logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                                "Failed to taproot pubkey. taproot is compress only.");
                  pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                  miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&miniscript,
                             "Failed to taproot uncompress pubkey. taproot is compress only.","");
                  CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                  __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
                }
                pDVar17 = (this->child_node_).
                          super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((long)(this->child_node_).
                          super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar17 == 0x2d0) {
                  ::std::__cxx11::string::operator=((string *)&pDVar17[1].parent_kind_,"tr");
                  AnalyzeScriptTree((this->child_node_).
                                    super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
                  this_00 = (this->child_node_).
                            super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1;
                  uVar7 = GetNeedArgumentNum(this_00);
                  if (uVar7 != 0) {
                    uVar18 = 0;
                    do {
                      miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&miniscript,"0","");
                      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&temp_args,&miniscript);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)miniscript._M_dataplus._M_p != &miniscript.field_2) {
                        operator_delete(miniscript._M_dataplus._M_p);
                      }
                      uVar18 = uVar18 + 1;
                      this_00 = (this->child_node_).
                                super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1;
                      uVar7 = GetNeedArgumentNum(this_00);
                    } while (uVar18 < uVar7);
                  }
                  GetTapBranch(&local_a8,this_00,&temp_args);
                  TapBranch::~TapBranch(&local_a8);
                }
                goto LAB_00410019;
              }
              if (lVar13 != 0x168) {
                temp_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)(lVar14 * 0x4fa4fa4fa4fa4fa5);
                miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x59e);
                miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                logger::log<unsigned_long&>
                          ((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                           "Failed to child node num. size={}",(unsigned_long *)&temp_args);
                pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&miniscript,"Failed to child node num.","");
                CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
              }
              iVar6 = ::std::__cxx11::string::compare((char *)this);
              if (((iVar6 == 0) && (parent_name->_M_string_length != 0)) &&
                 (iVar6 = ::std::__cxx11::string::compare((char *)parent_name), iVar6 != 0)) {
                miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x5a4);
                miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                              "Failed to wsh parent. only top or sh.");
                pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&miniscript,"Failed to wsh parent. only top or sh.","");
                CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
              }
              iVar6 = ::std::__cxx11::string::compare((char *)this);
              if (((iVar6 == 0) && (parent_name->_M_string_length != 0)) &&
                 (iVar6 = ::std::__cxx11::string::compare((char *)parent_name), iVar6 != 0)) {
                miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x5aa);
                miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                              "Failed to wpkh parent. only top or sh.");
                pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&miniscript,"Failed to wpkh parent. only top or sh.","");
                CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
              }
              iVar6 = ::std::__cxx11::string::compare((char *)this);
              if (((iVar6 == 0) ||
                  (iVar6 = ::std::__cxx11::string::compare((char *)this), iVar6 == 0)) &&
                 (pDVar17 = (this->child_node_).
                            super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 pDVar17->node_type_ != kDescriptorTypeScript)) {
                miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x5b3);
                miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                logger::log<cfd::core::DescriptorNodeType&>
                          ((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                           "Failed to check script type. child is script only. nodetype={}",
                           &pDVar17->node_type_);
                pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&miniscript,
                           "Failed to check script type. child is script only.","");
                CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
              }
              iVar6 = ::std::__cxx11::string::compare((char *)this);
              if (((iVar6 != 0) &&
                  (iVar6 = ::std::__cxx11::string::compare((char *)this), iVar6 != 0)) &&
                 (pDVar17 = (this->child_node_).
                            super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 pDVar17->node_type_ != kDescriptorTypeKey)) {
                miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x5be);
                miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                logger::log<cfd::core::DescriptorNodeType&>
                          ((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                           "Failed to check key-hash type. child is key only. nodetype={}",
                           &pDVar17->node_type_);
                pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&miniscript,"Failed to check key-hash type. child is key only."
                           ,"");
                CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
              }
              iVar6 = ::std::__cxx11::string::compare((char *)parent_name);
              if ((iVar6 == 0) &&
                 (iVar6 = ::std::__cxx11::string::compare((char *)this), iVar6 == 0)) {
                miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x5c5);
                miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                              "Failed to taproot. pkh is unsupported.");
                pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&miniscript,"Failed to taproot. pkh is unsupported.","");
                CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
              }
              ::std::__cxx11::string::_M_assign
                        ((string *)
                         &((this->child_node_).
                           super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ._M_impl.super__Vector_impl_data._M_start)->parent_kind_);
              AnalyzeAll((this->child_node_).
                         super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                         ._M_impl.super__Vector_impl_data._M_start,&this->name_);
              iVar6 = ::std::__cxx11::string::compare((char *)this);
              if (((iVar6 == 0) ||
                  (iVar6 = ::std::__cxx11::string::compare((char *)this), iVar6 == 0)) &&
                 (bVar5 = ExistUncompressedKey(this), bVar5)) {
                miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
                miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x5d0);
                miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
                logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                              "Failed to unsing uncompressed pubkey. witness cannot uncompressed pubkey."
                             );
                pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&miniscript,"Failed to unsing uncompressed pubkey.","");
                CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
                __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
              }
            }
          }
LAB_00410023:
          this->script_type_ = *(DescriptorScriptType *)(lVar16 + 0x6bba5a);
          return;
        }
      }
      lVar16 = lVar16 + 0x28;
    } while (lVar16 != 0x1de);
    iVar6 = ::std::__cxx11::string::compare((char *)parent_name);
    if (((iVar6 != 0) && (iVar6 = ::std::__cxx11::string::compare((char *)parent_name), iVar6 != 0))
       && (iVar6 = ::std::__cxx11::string::compare((char *)parent_name), iVar6 != 0)) {
      miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      miniscript._M_string_length = CONCAT44(miniscript._M_string_length._4_4_,0x517);
      miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9bcd5c;
      logger::log<>((CfdSourceLocation *)&miniscript,kCfdLogLevelWarning,
                    "Failed to analyze descriptor. script\'s name not found.");
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&miniscript,"Failed to analyze descriptor.","");
      CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&miniscript);
      __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
    }
    iVar6 = ::std::__cxx11::string::compare((char *)parent_name);
    __n_00 = 10000;
    if (iVar6 == 0) {
      __n_00 = 0x208;
    }
    ppuVar1 = &script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pcVar3 = (this->name_)._M_dataplus._M_p;
    script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&script,pcVar3,pcVar3 + (this->name_)._M_string_length);
    ::std::__cxx11::string::append((char *)&script);
    plVar8 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&script,(ulong)(this->value_)._M_dataplus._M_p);
    ppbVar2 = &temp_args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar11 = (pointer)(plVar8 + 2);
    if ((pointer)*plVar8 == pbVar11) {
      temp_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar11->_M_dataplus)._M_p;
      temp_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
    }
    else {
      temp_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar11->_M_dataplus)._M_p;
      temp_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar8;
    }
    temp_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar8[1];
    *plVar8 = (long)pbVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::append((char *)&temp_args);
    psVar12 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar12) {
      miniscript.field_2._M_allocated_capacity = *psVar12;
      miniscript.field_2._8_8_ = plVar8[3];
      miniscript._M_dataplus._M_p = (pointer)&miniscript.field_2;
    }
    else {
      miniscript.field_2._M_allocated_capacity = *psVar12;
      miniscript._M_dataplus._M_p = (pointer)*plVar8;
    }
    miniscript._M_string_length = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (temp_args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
      operator_delete(temp_args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar1) {
      operator_delete(script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&script,__n_00,(allocator_type *)&temp_args);
    written = 0;
    iVar6 = ::std::__cxx11::string::compare((char *)parent_name);
    iVar6 = wally_descriptor_parse_miniscript
                      (miniscript._M_dataplus._M_p,(char **)0x0,(char **)0x0,0,0,(uint)(iVar6 == 0),
                       script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       CONCAT44(script.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                script.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_4_) -
                       (long)script.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,&written);
    if (iVar6 != 0) {
      temp_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x583b45;
      temp_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(temp_args.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x50e);
      temp_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_9bcd5c;
      logger::log<>((CfdSourceLocation *)&temp_args,kCfdLogLevelWarning,
                    "Failed to analyze descriptor. parse miniscript fail.");
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      temp_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&temp_args,"Failed to analyze descriptor. parse miniscript fail.","");
      CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)&temp_args);
      __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
    }
    this->script_type_ = kDescriptorScriptMiniscript;
    ::std::__cxx11::string::_M_assign((string *)&this->value_);
    ::std::__cxx11::string::_M_replace
              ((ulong)this,0,(char *)(this->name_)._M_string_length,0x518f24);
    this->number_ = (uint32_t)written;
    lVar16 = ::std::__cxx11::string::find((char *)&miniscript,0x4ddb5c,0);
    this->need_arg_num_ = (uint)(lVar16 != -1);
    pDVar17 = (this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar4 = (this->child_node_).
             super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = pDVar17;
    if (pDVar4 != pDVar17) {
      do {
        ~DescriptorNode(this_01);
        this_01 = this_01 + 1;
      } while (this_01 != pDVar4);
      (this->child_node_).
      super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = pDVar17;
    }
    if (script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)miniscript._M_dataplus._M_p != &miniscript.field_2) {
      operator_delete(miniscript._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void DescriptorNode::AnalyzeAll(const std::string& parent_name) {
  if (node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
    return;
  }
  if (node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
    AnalyzeKey();
    return;
  }
  if (name_.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to name field empty. Analyze NG.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to analyze descriptor.");
  }

  const DescriptorNodeScriptData* p_data = nullptr;
  for (const auto& node_data : kDescriptorNodeScriptTable) {
    if (name_ == node_data.name) {
      p_data = &node_data;
      break;
    }
  }
  if (p_data == nullptr) {
    if ((parent_name == "wsh") || (parent_name == "sh") ||
        (parent_name == "tr")) {
      size_t max_size = (parent_name == "sh") ? Script::kMaxRedeemScriptSize
                                              : Script::kMaxScriptSize;
      std::string miniscript = name_ + "(" + value_ + ")";
      std::vector<unsigned char> script(max_size);
      size_t written = 0;
      uint32_t flags = WALLY_MINISCRIPT_WITNESS_SCRIPT;
      if (parent_name == "tr") flags = WALLY_MINISCRIPT_TAPSCRIPT;
      int ret = wally_descriptor_parse_miniscript(
          miniscript.c_str(), nullptr, nullptr, 0, 0, flags, script.data(),
          script.size(), &written);
      if (ret == WALLY_OK) {
        script_type_ = DescriptorScriptType::kDescriptorScriptMiniscript;
        value_ = miniscript;
        name_ = "miniscript";
        number_ = static_cast<uint32_t>(written);
        need_arg_num_ = (miniscript.find("*") != std::string::npos) ? 1 : 0;
        child_node_.clear();
        return;
      } else {
        warn(
            CFD_LOG_SOURCE,
            "Failed to analyze descriptor. parse miniscript fail.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to analyze descriptor. parse miniscript fail.");
      }
    }

    warn(
        CFD_LOG_SOURCE,
        "Failed to analyze descriptor. script's name not found.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to analyze descriptor.");
  }

  if (p_data->top_only && (depth_ != 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to analyse descriptor. The target can only exist at the top.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to analyse descriptor. The target can only exist at the top.");
  }
  if (p_data->has_child) {
    if (child_node_.empty()) {
      warn(CFD_LOG_SOURCE, "Failed to child node empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Failed to child node empty.");
    }
  } else if (!child_node_.empty()) {
    warn(
        CFD_LOG_SOURCE, "Failed to child node num. size={}",
        child_node_.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to child node num.");
  }

  if (p_data->multisig) {
    if (parent_kind_ == "tr") {
      warn(CFD_LOG_SOURCE, "Failed to multisig. taproot is unsupported.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to multisig. taproot is unsupported.");
    }
    if (child_node_.size() < 2) {
      warn(
          CFD_LOG_SOURCE, "Failed to multisig node low. size={}",
          child_node_.size());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Failed to multisig node low.");
    }
    size_t pubkey_num = child_node_.size() - 1;
    if ((child_node_[0].number_ == 0) ||
        (pubkey_num < static_cast<size_t>(child_node_[0].number_))) {
      warn(
          CFD_LOG_SOURCE, "Failed to multisig require num. num={}",
          child_node_[0].number_);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to multisig require num.");
    }
    size_t max_pubkey_num =
        (parent_name == "wsh") ? Script::kMaxMultisigPubkeyNum : 16;
    if (pubkey_num > max_pubkey_num) {
      warn(
          CFD_LOG_SOURCE, "Failed to multisig pubkey num. num={}",
          child_node_.size() - 1);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to multisig pubkey num.");
    }
    for (auto& child : child_node_) {
      child.AnalyzeAll(name_);
    }
    if (parent_name == "sh") {
      script_type_ = p_data->type;
      DescriptorScriptReference ref = GetReference(nullptr);
      Script script = ref.GetLockingScript();
      if ((script.GetData().GetDataSize() + 3) >
          Script::kMaxRedeemScriptSize) {
        warn(
            CFD_LOG_SOURCE, "Failed to script size over. size={}",
            script.GetData().GetDataSize());
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Failed to script size over.");
      }
    } else if (parent_name == "wsh") {
      // check compress pubkey
      std::vector<std::string> temp_args;
      for (auto& child : child_node_) {
        if (child.node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
          continue;
        }
        temp_args.push_back("0");
        if (!child.GetPubkey(&temp_args).IsCompress()) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to multisig uncompress pubkey. wsh is compress only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to multisig uncompress pubkey. wsh is compress only.");
        }
      }
    }
  } else if (name_ == "addr") {
    Address addr(value_, addr_prefixes_);
    info(CFD_LOG_SOURCE, "Address={}", addr.GetAddress());
  } else if (name_ == "raw") {
    Script script(value_);
    info(CFD_LOG_SOURCE, "script size={}", script.GetData().GetDataSize());
  } else if (name_ == "tr") {
    if ((child_node_.size() != 1) && (child_node_.size() != 2)) {
      warn(
          CFD_LOG_SOURCE, "Failed to taproot node num. size={}",
          child_node_.size());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot node num." + child_node_[0].value_);
    }
    child_node_[0].node_type_ = DescriptorNodeType::kDescriptorTypeKey;
    child_node_[0].parent_kind_ = "tr";
    child_node_[0].AnalyzeAll(name_);

    std::vector<std::string> temp_args;
    temp_args.push_back("0");
    if (!child_node_[0].GetPubkey(&temp_args).IsCompress()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to taproot pubkey. taproot is compress only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot uncompress pubkey. taproot is compress only.");
    }
    if (child_node_.size() == 2) {
      child_node_[1].parent_kind_ = "tr";
      child_node_[1].AnalyzeScriptTree();
      for (uint32_t index = 0; index < child_node_[1].GetNeedArgumentNum();
           ++index) {
        temp_args.push_back("0");
      }
      child_node_[1].GetTapBranch(&temp_args);  // check
    }
  } else if (child_node_.size() != 1) {
    warn(
        CFD_LOG_SOURCE, "Failed to child node num. size={}",
        child_node_.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to child node num.");
  } else {
    if ((name_ == "wsh") && (!parent_name.empty()) && (parent_name != "sh")) {
      warn(CFD_LOG_SOURCE, "Failed to wsh parent. only top or sh.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to wsh parent. only top or sh.");
    } else if (
        (name_ == "wpkh") && (!parent_name.empty()) && (parent_name != "sh")) {
      warn(CFD_LOG_SOURCE, "Failed to wpkh parent. only top or sh.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to wpkh parent. only top or sh.");
    } else if (
        ((name_ == "wsh") || (name_ == "sh")) &&
        (child_node_[0].node_type_ !=
         DescriptorNodeType::kDescriptorTypeScript)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to check script type. child is script only. nodetype={}",
          child_node_[0].node_type_);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to check script type. child is script only.");
    } else if (
        (name_ != "wsh") && (name_ != "sh") &&
        (child_node_[0].node_type_ !=
         DescriptorNodeType::kDescriptorTypeKey)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to check key-hash type. child is key only. nodetype={}",
          child_node_[0].node_type_);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to check key-hash type. child is key only.");
    } else if ((parent_name == "tr") && (name_ == "pkh")) {
      warn(CFD_LOG_SOURCE, "Failed to taproot. pkh is unsupported.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot. pkh is unsupported.");
    }
    child_node_[0].parent_kind_ = parent_kind_;
    child_node_[0].AnalyzeAll(name_);

    if ((name_ == "wpkh") || (name_ == "wsh")) {
      if (ExistUncompressedKey()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to unsing uncompressed pubkey."
            " witness cannot uncompressed pubkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to unsing uncompressed pubkey.");
      }
    }
  }
  script_type_ = p_data->type;
}